

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_consolebuffer.cpp
# Opt level: O0

void __thiscall
FConsoleBuffer::AddText(FConsoleBuffer *this,int printlevel,char *text,FILE *logfile)

{
  size_t local_48;
  size_t textsize;
  FString local_30;
  FString build;
  FILE *logfile_local;
  char *text_local;
  int printlevel_local;
  FConsoleBuffer *this_local;
  
  build.Chars = (char *)logfile;
  FString::FString(&local_30,"\x1cB");
  text_local._4_4_ = printlevel;
  if (this->mAddType == REPLACELINE) {
    TArray<FString,_FString>::Pop(&this->mConsoleText);
    this->mLastLineNeedsUpdate = true;
  }
  else if (this->mAddType == APPENDLINE) {
    TArray<FString,_FString>::Pop(&this->mConsoleText,&local_30);
    text_local._4_4_ = -1;
    this->mLastLineNeedsUpdate = true;
  }
  if ((-1 < text_local._4_4_) && (text_local._4_4_ != 2)) {
    if (text_local._4_4_ == 200) {
      FString::operator=(&local_30,"\x1cD");
    }
    else if (text_local._4_4_ < 5) {
      FString::Format(&local_30,"%c%c",0x1c,(ulong)(uint)PrintColors[text_local._4_4_]);
    }
  }
  local_48 = strlen(text);
  if (text[local_48 - 1] == '\r') {
    local_48 = local_48 - 1;
    this->mAddType = REPLACELINE;
  }
  else if (text[local_48 - 1] == '\n') {
    local_48 = local_48 - 1;
    this->mAddType = NEWLINE;
  }
  else {
    this->mAddType = APPENDLINE;
  }
  FString::AppendCStrPart(&local_30,text,local_48);
  TArray<FString,_FString>::Push(&this->mConsoleText,&local_30);
  if (build.Chars != (char *)0x0) {
    WriteLineToLog(this,(FILE *)build.Chars,text);
  }
  FString::~FString(&local_30);
  return;
}

Assistant:

void FConsoleBuffer::AddText(int printlevel, const char *text, FILE *logfile)
{
	FString build = TEXTCOLOR_TAN;
	
	if (mAddType == REPLACELINE)
	{
		// Just wondering: Do we actually need this case? If so, it may need some work.
		mConsoleText.Pop();	// remove the line to be replaced
		mLastLineNeedsUpdate = true;
	}
	else if (mAddType == APPENDLINE)
	{
		mConsoleText.Pop(build);
		printlevel = -1;
		mLastLineNeedsUpdate = true;
	}
	
	if (printlevel >= 0 && printlevel != PRINT_HIGH)
	{
		if (printlevel == 200) build = TEXTCOLOR_GREEN;
		else if (printlevel < PRINTLEVELS) build.Format("%c%c", TEXTCOLOR_ESCAPE, PrintColors[printlevel]);
	}
	
	size_t textsize = strlen(text);
	
	if (text[textsize-1] == '\r')
	{
		textsize--;
		mAddType = REPLACELINE;
	}
	else if (text[textsize-1] == '\n')
	{
		textsize--;
		mAddType = NEWLINE;
	}
	else
	{
		mAddType = APPENDLINE;
	}

	// don't bother about linefeeds etc. inside the text, we'll let the formatter sort this out later.
	build.AppendCStrPart(text, textsize);
	mConsoleText.Push(build);
	if (logfile != NULL) WriteLineToLog(logfile, text);
}